

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_target(t_parser *this,bool a_assignable)

{
  t_at *ptVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  size_t *psVar4;
  pointer *ppptVar5;
  intptr_t iVar6;
  t_token tVar7;
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_Var8;
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_Var9;
  pointer pptVar10;
  iterator iVar11;
  _Alloc_hider _Var12;
  wstring_view a_value;
  wstring_view a_value_00;
  wstring_view a_value_01;
  wstring_view a_value_02;
  t_lexer *this_00;
  undefined8 uVar13;
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
  *p_Var14;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> _Var15;
  bool bVar16;
  FILE *pFVar17;
  t_object *ptVar18;
  undefined8 *puVar19;
  t_script *ptVar20;
  anon_union_8_3_60b33e96_for_t_lexer_12 aVar21;
  undefined8 *puVar22;
  t_object *ptVar23;
  t_lambda *this_01;
  _Base_ptr p_Var24;
  undefined **ppuVar25;
  _Base_ptr p_Var26;
  wint_t in_EDX;
  _Base_ptr p_Var27;
  wchar_t *pwVar28;
  pointer *__ptr;
  ulong uVar29;
  undefined7 in_register_00000031;
  t_parser *this_02;
  size_t sVar30;
  t_parser *this_03;
  _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
  *this_04;
  t_scope *ptVar31;
  long lVar32;
  char *pcVar33;
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_Var34;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_bool>
  pVar35;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  wstring_view a_message_02;
  wstring_view a_message_03;
  wstring_view a_message_04;
  wstring_view a_message_05;
  t_object *symbol;
  t_at at;
  t_script *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 uVar36;
  undefined7 in_stack_ffffffffffffff61;
  undefined7 uVar37;
  undefined1 local_98 [24];
  undefined1 local_80 [16];
  FILE *pFStack_70;
  size_t local_68;
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
  *local_60;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_58;
  wchar_t *local_50;
  vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>> *local_48;
  t_object *local_40;
  t_object *local_38;
  
  this_02 = (t_parser *)CONCAT71(in_register_00000031,a_assignable);
  local_68 = (this_02->v_lexer).v_at.v_column;
  local_80._8_8_ = (this_02->v_lexer).v_at.v_position;
  pFStack_70 = (FILE *)(this_02->v_lexer).v_at.v_line;
  tVar7 = (this_02->v_lexer).v_token;
  if (0x2c < tVar7 - c_token__APOSTROPHE) {
switchD_001680ac_caseD_6:
    pwVar28 = L"unexpected token.";
    sVar30 = 0x11;
LAB_0016931b:
    a_message._M_str = pwVar28;
    a_message._M_len = sVar30;
    f_throw(this_02,a_message);
  }
  this_03 = (t_parser *)&this_02->v_lexer;
  ptVar1 = &(this_02->v_lexer).v_at;
  uVar36 = SUB81(this_03,0);
  uVar37 = (undefined7)((ulong)this_03 >> 8);
  local_58._M_head_impl = (t_node *)this;
  switch(tVar7) {
  case c_token__APOSTROPHE:
    t_lexer::f_next((t_lexer *)this_03);
    tVar7 = (this_02->v_lexer).v_token;
    if (tVar7 != c_token__LEFT_PARENTHESIS) {
      if (tVar7 == c_token__SYMBOL) {
        ptVar20 = this_02->v_module;
        a_value_00._M_str._0_1_ = in_stack_ffffffffffffff60;
        a_value_00._M_len = (size_t)in_stack_ffffffffffffff58;
        a_value_00._M_str._1_7_ = in_stack_ffffffffffffff61;
        ptVar18 = t_symbol::f_instantiate(a_value_00);
        ptVar18 = t_script::f_slot(ptVar20,ptVar18);
        t_lexer::f_next((t_lexer *)this_03);
        ptVar20 = (t_script *)operator_new(0x28);
        (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
        (ptVar20->v_path)._M_dataplus._M_p = (pointer)local_80._8_8_;
        (ptVar20->v_path)._M_string_length = (size_type)pFStack_70;
        (ptVar20->v_path).field_2._M_allocated_capacity = local_68;
        (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019b458;
        *(t_object **)((long)&(ptVar20->v_path).field_2 + 8) = ptVar18;
        this->v_module = ptVar20;
        return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
      }
      pwVar28 = L"expecting symbol or \'(\'.";
LAB_001693c9:
      sVar30 = 0x18;
      goto LAB_0016931b;
    }
    pwVar28 = (this_02->v_lexer).v_indent.v_i;
    ptVar18 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar23 = t_script::f_slot(this_02->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8) + -0x48));
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    *puVar22 = &PTR__t_node_0019b458;
    puVar22[4] = ptVar23;
    ptVar20 = (t_script *)operator_new(0x48);
    uVar29 = (long)pwVar28 + (-0x50 - (long)ptVar18);
    (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
    (ptVar20->v_path)._M_dataplus._M_p = (pointer)local_80._8_8_;
    (ptVar20->v_path)._M_string_length = (size_type)pFStack_70;
    (ptVar20->v_path).field_2._M_allocated_capacity = local_68;
    (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_call_0019b298;
    *(undefined8 **)((long)&(ptVar20->v_path).field_2 + 8) = puVar22;
    (ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    *(undefined8 *)
     ((long)&(ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_map_size + 1) = 0;
    *(undefined8 *)
     ((long)&(ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur + 1) = 0;
    if ((this_02->v_lexer).v_newline == true) {
      if (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))) {
        tVar7 = (this_02->v_lexer).v_token;
        goto joined_r0x00168ea2;
      }
    }
    else {
      tVar7 = (this_02->v_lexer).v_token;
joined_r0x00168ea2:
      if (tVar7 != c_token__RIGHT_PARENTHESIS) {
        bVar16 = f_expressions(this_02,(long)uVar29 >> 2,
                               (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                                *)&ptVar20->v_slots);
        *(bool *)&(ptVar20->v_slots).
                  super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first = bVar16;
      }
    }
    if ((((this_02->v_lexer).v_newline != true) ||
        (uVar29 <= (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token == c_token__RIGHT_PARENTHESIS)) {
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
    }
    goto LAB_00168ee9;
  case c_token__LEFT_PARENTHESIS:
    t_lexer::f_next((t_lexer *)this_03);
    f_expression(this);
    if ((this_02->v_lexer).v_token == c_token__RIGHT_PARENTHESIS) {
      t_lexer::f_next((t_lexer *)this_03);
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
    }
    a_message_03._M_str = L"expecting \')\'.";
    a_message_03._M_len = 0xe;
    f_throw(this_02,a_message_03);
  default:
    goto switchD_001680ac_caseD_6;
  case c_token__COLON:
  case c_token__SYMBOL:
  case c_token__SELF:
    ptVar31 = this_02->v_scope;
    if (tVar7 == c_token__COLON) {
      local_80._0_8_ = (this_02->v_lexer).field_11.v_integer;
      for (pFVar17 = (FILE *)local_80._0_8_; pFVar17 != (FILE *)0x0; pFVar17 = pFVar17 + -1) {
        if (ptVar31 == (t_scope *)0x0) goto LAB_0016930f;
        ptVar31 = ptVar31->v_outer;
      }
      t_lexer::f_next((t_lexer *)this_03);
    }
    else {
      local_80._0_8_ = (FILE *)0x0;
    }
    uVar13 = local_80._0_8_;
    tVar7 = (this_02->v_lexer).v_token;
    if (tVar7 == c_token__SELF) {
      if (ptVar31 == (t_scope *)0x0) {
LAB_0016930f:
        pwVar28 = L"no more outer scope.";
        sVar30 = 0x14;
        goto LAB_0016931b;
      }
      local_60 = (_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                  *)CONCAT44(local_60._4_4_,in_EDX);
      if ((FILE *)local_80._0_8_ != (FILE *)0x0) {
        ptVar31->v_self_shared = true;
      }
      puVar19 = (undefined8 *)operator_new(0x28);
      *puVar19 = &PTR__t_node_0019ac90;
      puVar19[1] = local_80._8_8_;
      puVar19[2] = pFStack_70;
      puVar19[3] = local_68;
      *puVar19 = &PTR__t_node_0019b0e8;
      puVar19[4] = uVar13;
      pwVar28 = (this_02->v_lexer).v_value.v_i;
      for (pcVar33 = ((this_02->v_lexer).v_value.v_p)->v_data + 8; (wchar_t *)pcVar33 != pwVar28;
          pcVar33 = pcVar33 + 4) {
        if (*(int *)pcVar33 == 0x40) {
          puVar22 = (undefined8 *)operator_new(0x28);
          *puVar22 = &PTR__t_node_0019ac90;
          puVar22[1] = local_80._8_8_;
          puVar22[2] = pFStack_70;
          puVar22[3] = local_68;
          ppuVar25 = &PTR__t_class_0019b130;
        }
        else {
          puVar22 = (undefined8 *)operator_new(0x28);
          *puVar22 = &PTR__t_node_0019ac90;
          puVar22[1] = local_80._8_8_;
          puVar22[2] = pFStack_70;
          puVar22[3] = local_68;
          ppuVar25 = &PTR__t_super_0019b178;
        }
        *puVar22 = ppuVar25;
        puVar22[4] = puVar19;
        puVar19 = puVar22;
      }
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
      this = (t_parser *)local_58._M_head_impl;
      p_Var14 = local_60;
      if (((this_02->v_lexer).v_newline != false) || ((this_02->v_lexer).v_token != c_token__SYMBOL)
         ) goto LAB_00168c7c;
      local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
      local_98._0_8_ = ptVar1->v_position;
      local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
      ptVar20 = this_02->v_module;
      a_value_02._M_str._0_1_ = uVar36;
      a_value_02._M_len = (size_t)in_stack_ffffffffffffff58;
      a_value_02._M_str._1_7_ = uVar37;
      ptVar18 = t_symbol::f_instantiate(a_value_02);
      ptVar18 = t_script::f_slot(ptVar20,ptVar18);
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
      if ((this_02->v_lexer).v_token != c_token__EQUAL) {
        puVar22 = (undefined8 *)operator_new(0x30);
        *puVar22 = &PTR__t_node_0019ac90;
        ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
        (puVar22 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
             (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
        puVar22[2] = local_98._8_8_;
        puVar22[3] = local_98._16_8_;
        *puVar22 = &PTR__t_object_get_0019aed8;
        puVar22[4] = puVar19;
        puVar22[5] = ptVar18;
        goto LAB_00168e48;
      }
      if ((char)p_Var14 == '\0') {
        a_message_04._M_str = L"can not assign to expression.";
        a_message_04._M_len = 0x1d;
        f_throw(this_02,a_message_04);
      }
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
      f_expression((t_parser *)&stack0xffffffffffffff58);
      puVar22 = (undefined8 *)operator_new(0x38);
      *puVar22 = &PTR__t_node_0019ac90;
      ((tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)(puVar22 + 1))->
      super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> =
           (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
           local_98._0_8_;
      puVar22[2] = local_98._8_8_;
      puVar22[3] = local_98._16_8_;
      *puVar22 = &PTR__t_object_put_0019af50;
      puVar22[4] = puVar19;
    }
    else {
      if (tVar7 != c_token__SYMBOL) {
        pwVar28 = L"expecting symbol or self.";
        sVar30 = 0x19;
        goto LAB_0016931b;
      }
      ptVar20 = this_02->v_module;
      a_value._M_str._0_1_ = in_stack_ffffffffffffff60;
      a_value._M_len = (size_t)in_stack_ffffffffffffff58;
      a_value._M_str._1_7_ = in_stack_ffffffffffffff61;
      ptVar18 = t_symbol::f_instantiate(a_value);
      local_98._0_8_ = t_script::f_slot(ptVar20,ptVar18);
      t_lexer::f_next((t_lexer *)this_03);
      uVar13 = local_80._0_8_;
      if ((this_02->v_lexer).v_token != c_token__EQUAL) {
        if (ptVar31 != (t_scope *)0x0) {
          this_04 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                     *)&ptVar31->v_unresolveds;
          if ((FILE *)local_80._0_8_ == (FILE *)0x0) {
            this_04 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                       *)&ptVar31->v_references;
          }
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>(this_04,(t_object **)local_98);
        }
        puVar22 = (undefined8 *)operator_new(0x48);
        *puVar22 = &PTR__t_node_0019ac90;
        puVar22[3] = local_68;
        puVar22[1] = local_80._8_8_;
        puVar22[2] = pFStack_70;
        *puVar22 = &PTR__t_node_0019b070;
        puVar22[4] = uVar13;
        puVar22[5] = ptVar31;
        ((__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
          *)(puVar22 + 6))->
        super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> =
             (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
             local_98._0_8_;
        puVar22[8] = 0;
        goto LAB_00168e48;
      }
      if ((char)in_EDX == '\0') {
        pwVar28 = L"can not assign to expression.";
        sVar30 = 0x1d;
        goto LAB_0016931b;
      }
      if (ptVar31 == (t_scope *)0x0) goto LAB_0016930f;
      t_lexer::f_next((t_lexer *)this_03);
      ptVar18 = (t_object *)f_variable(this_03,ptVar31,(t_object *)local_98._0_8_);
      if ((FILE *)uVar13 != (FILE *)0x0) {
        *(undefined2 *)&ptVar18->v_next = 0x101;
      }
      f_expression((t_parser *)&stack0xffffffffffffff58);
      puVar22 = (undefined8 *)operator_new(0x38);
      *puVar22 = &PTR__t_node_0019ac90;
      puVar22[1] = local_80._8_8_;
      puVar22[2] = pFStack_70;
      puVar22[3] = local_68;
      *puVar22 = &PTR__t_scope_put_0019b0a0;
      puVar22[4] = uVar13;
    }
    puVar22[5] = ptVar18;
    puVar22[6] = in_stack_ffffffffffffff58;
    goto LAB_00168e48;
  case c_token__ATMARK:
    pwVar28 = (this_02->v_lexer).v_indent.v_i;
    ptVar18 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    this_01 = (t_lambda *)operator_new(0x1d0);
    local_80._0_8_ = this_01;
    ast::t_lambda::t_lambda(this_01,(t_at *)(local_80 + 8),this_02->v_scope);
    if (((this_02->v_lexer).v_newline == false) &&
       ((this_02->v_lexer).v_token == c_token__LEFT_PARENTHESIS)) {
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
      if ((this_02->v_lexer).v_token != c_token__RIGHT_PARENTHESIS) {
        local_48 = (vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                    *)(local_80._0_8_ + 0xd8);
        local_60 = (_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                    *)(local_80._0_8_ + 0xa8);
        local_38 = (t_object *)(local_80._0_8_ + 0x1b8);
        local_50 = L"expecting symbol or \'*\'.";
        while (tVar7 = (this_02->v_lexer).v_token, tVar7 == c_token__SYMBOL) {
          ptVar20 = this_02->v_module;
          a_value_01._M_str._0_1_ = uVar36;
          a_value_01._M_len = (size_t)in_stack_ffffffffffffff58;
          a_value_01._M_str._1_7_ = uVar37;
          ptVar23 = t_symbol::f_instantiate(a_value_01);
          local_40 = t_script::f_slot(ptVar20,ptVar23);
          local_98._0_8_ =
               (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
               0x0;
          local_98._8_8_ = 0;
          pVar35 = std::
                   _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                   ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                             (local_60,&local_40,(t_variable *)local_98);
          in_stack_ffffffffffffff58 = (t_script *)&pVar35.first._M_node._M_node[1]._M_parent;
          std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
          emplace_back<xemmai::t_code::t_variable*>
                    (local_48,(t_variable **)&stack0xffffffffffffff58);
          t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
          if ((this_02->v_lexer).v_token == c_token__EQUAL) {
            t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
            f_expression((t_parser *)local_98);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)local_38,
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )local_98);
            if ((_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_ !=
                (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)0x0) {
              (*(code *)((t_object *)((t_body *)local_98._0_8_)->_vptr_t_body)->v_previous)();
            }
          }
          else if ((this_01->v_defaults).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   (this_01->v_defaults).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
            sVar30 = 0xe;
            local_50 = L"expecting \'=\'.";
            goto LAB_0016934f;
          }
          tVar7 = (this_02->v_lexer).v_token;
          if (((this_02->v_lexer).v_newline & tVar7 != c_token__RIGHT_PARENTHESIS) == 0) {
            if (tVar7 != c_token__COMMA) goto LAB_00168f61;
            t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
          }
        }
        if (tVar7 != c_token__ASTERISK) {
          sVar30 = 0x18;
LAB_0016934f:
          a_message_01._M_str = local_50;
          a_message_01._M_len = sVar30;
          f_throw(this_02,a_message_01);
        }
        t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
        if ((this_02->v_lexer).v_token != c_token__SYMBOL) {
          local_50 = L"expecting symbol.";
          sVar30 = 0x11;
          goto LAB_0016934f;
        }
        local_40 = f_symbol(this_02);
        this_00 = (t_lexer *)CONCAT71(uVar37,uVar36);
        local_98._0_8_ =
             (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)0x0;
        local_98._8_8_ = 0;
        std::
        _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
        ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                  (local_60,&local_40,(t_variable *)local_98);
        std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
        emplace_back<xemmai::t_code::t_variable*>(local_48,(t_variable **)&stack0xffffffffffffff58);
        this_01->v_variadic = true;
        t_lexer::f_next(this_00);
LAB_00168f61:
        if ((this_02->v_lexer).v_token != c_token__RIGHT_PARENTHESIS) {
          local_50 = L"expecting \')\'.";
          sVar30 = 0xe;
          goto LAB_0016934f;
        }
      }
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
    }
    uVar29 = (long)pwVar28 + (-0x50 - (long)ptVar18);
    this_01->v_arguments =
         (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_node_count;
    this_02->v_scope->v_shared = true;
    ptVar31 = (t_scope *)(local_80._0_8_ + 0x20);
    this_02->v_scope = ptVar31;
    bVar16 = (this_02->v_lexer).v_newline;
    uVar36 = this_02->v_can_jump;
    local_60 = (_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                *)CONCAT71(local_60._1_7_,this_02->v_can_return);
    this_02->v_can_return = true;
    if (bVar16 == true) {
      if (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))) {
        f_block(this_02,(vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                         *)(local_80._0_8_ + 0x28));
      }
    }
    else {
      f_expression((t_parser *)local_98);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)(local_80._0_8_ + 0x28),
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 local_98);
      if ((t_script *)local_98._0_8_ != (t_script *)0x0) {
        (*(code *)((t_object *)((t_body *)local_98._0_8_)->_vptr_t_body)->v_previous)();
      }
      if (((this_02->v_lexer).v_newline == true) &&
         (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) {
        a_message_05._M_str = L"unexpected indent.";
        a_message_05._M_len = 0x12;
        f_throw(this_02,a_message_05);
      }
    }
    p_Var24 = (this_01->super_t_scope).v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var2 = (_Base_ptr)(local_80._0_8_ + 0x80);
    if (p_Var24 != p_Var2) {
      p_Var3 = (_Base_ptr)(local_80._0_8_ + 0xb0);
      do {
        local_98._0_8_ = *(undefined8 *)(p_Var24 + 1);
        p_Var26 = p_Var3;
        for (p_Var27 = (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_parent; (_Rb_tree_header *)p_Var27 != (_Rb_tree_header *)0x0;
            p_Var27 = (&p_Var27->_M_left)[*(t_script **)(p_Var27 + 1) < (ulong)local_98._0_8_]) {
          if (*(t_script **)(p_Var27 + 1) >= (ulong)local_98._0_8_) {
            p_Var26 = p_Var27;
          }
        }
        p_Var27 = p_Var3;
        if ((p_Var26 != p_Var3) &&
           (p_Var27 = p_Var26, (ulong)local_98._0_8_ < *(t_script **)(p_Var26 + 1))) {
          p_Var27 = p_Var3;
        }
        if (p_Var27 == p_Var3) {
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>
                    ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                      *)&ptVar31->v_outer->v_unresolveds,(t_object **)local_98);
        }
        else {
          *(undefined1 *)&p_Var27[1]._M_parent = 1;
        }
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != p_Var2);
    }
    p_Var24 = (this_01->super_t_scope).v_references._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var2 = (_Base_ptr)(local_80._0_8_ + 0x50);
    if (p_Var24 != p_Var2) {
      p_Var3 = (_Base_ptr)(local_80._0_8_ + 0xb0);
      do {
        local_98._0_8_ = *(undefined8 *)(p_Var24 + 1);
        p_Var26 = p_Var3;
        for (p_Var27 = (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_parent; (_Rb_tree_header *)p_Var27 != (_Rb_tree_header *)0x0;
            p_Var27 = (&p_Var27->_M_left)[*(t_node **)(p_Var27 + 1) < (ulong)local_98._0_8_]) {
          if (*(t_node **)(p_Var27 + 1) >= (ulong)local_98._0_8_) {
            p_Var26 = p_Var27;
          }
        }
        p_Var27 = p_Var3;
        if ((p_Var26 != p_Var3) &&
           (p_Var27 = p_Var26, (ulong)local_98._0_8_ < *(t_node **)(p_Var26 + 1))) {
          p_Var27 = p_Var3;
        }
        if (p_Var27 == p_Var3) {
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>
                    ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                      *)&ptVar31->v_outer->v_unresolveds,(t_object **)local_98);
        }
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != p_Var2);
    }
    this_02->v_scope = (this_01->super_t_scope).v_outer;
    this_02->v_can_jump = (bool)uVar36;
    this_02->v_can_return = local_60._0_1_;
    p_Var8 = (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             (this_01->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var9 = (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             (this_01->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pptVar10 = (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar36 = SUB81(pptVar10,0);
    uVar37 = (undefined7)((ulong)pptVar10 >> 8);
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((this_01->super_t_scope).v_self_shared != false) {
      psVar4 = &(this_01->super_t_scope).v_shareds;
      *psVar4 = *psVar4 + 1;
    }
    local_80._0_8_ = local_80._0_8_ + 0xd8;
    p_Var34 = p_Var8;
    if (this_01->v_arguments != 0) {
      lVar32 = this_01->v_arguments << 3;
      do {
        local_98._0_8_ = p_Var34->_M_t;
        if (*(char *)local_98._0_8_ == '\x01') {
          ptVar18 = (t_object *)(this_01->super_t_scope).v_shareds;
          (this_01->super_t_scope).v_shareds = (size_t)((long)&ptVar18->v_next + 1);
        }
        else {
          ptVar18 = (t_object *)
                    ((long)(this_01->super_t_scope).v_privates.
                           super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->super_t_scope).v_privates.
                           super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        (((wstring *)(local_98._0_8_ + 8))->_M_dataplus)._M_p = (pointer)ptVar18;
        iVar11._M_current =
             (this_01->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this_01->super_t_scope).v_privates.
            super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
          _M_realloc_insert<xemmai::t_code::t_variable*const&>
                    ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                      *)local_80._0_8_,iVar11,(t_variable **)local_98);
        }
        else {
          *iVar11._M_current = (t_variable *)local_98._0_8_;
          ppptVar5 = &(this_01->super_t_scope).v_privates.
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar5 = *ppptVar5 + 1;
        }
        p_Var34 = p_Var34 + 1;
        lVar32 = lVar32 + -8;
      } while (lVar32 != 0);
    }
    if (p_Var34 != p_Var9) {
      do {
        local_98._0_8_ = p_Var34->_M_t;
        if (*(char *)&((t_node *)local_98._0_8_)->_vptr_t_node == '\x01') {
          _Var12._M_p = (pointer)(this_01->super_t_scope).v_shareds;
          (this_01->super_t_scope).v_shareds = (size_t)((long)_Var12._M_p + 1);
          (((wstring *)&((t_node *)local_98._0_8_)->v_at)->_M_dataplus)._M_p = _Var12._M_p;
        }
        else {
          iVar11._M_current =
               (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (((wstring *)&((t_node *)local_98._0_8_)->v_at)->_M_dataplus)._M_p =
               (pointer)((long)iVar11._M_current -
                         (long)(this_01->super_t_scope).v_privates.
                               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3);
          if (iVar11._M_current ==
              (this_01->super_t_scope).v_privates.
              super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
            _M_realloc_insert<xemmai::t_code::t_variable*const&>
                      ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                        *)local_80._0_8_,iVar11,(t_variable **)local_98);
          }
          else {
            *iVar11._M_current = (t_variable *)local_98._0_8_;
            ppptVar5 = &(this_01->super_t_scope).v_privates.
                        super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *ppptVar5 = *ppptVar5 + 1;
          }
        }
        p_Var34 = p_Var34 + 1;
      } while (p_Var34 != p_Var9);
    }
    _Var15._M_head_impl = local_58._M_head_impl;
    (local_58._M_head_impl)->_vptr_t_node = (_func_int **)this_01;
    if (p_Var8 == (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                  )0x0) {
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
             local_58._M_head_impl;
    }
    operator_delete(p_Var8,CONCAT71(uVar37,uVar36) - (long)p_Var8);
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
           _Var15._M_head_impl;
  case c_token__LEFT_BRACKET:
    pwVar28 = (this_02->v_lexer).v_indent.v_i;
    ptVar18 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar23 = t_script::f_slot(this_02->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1b8) + -0x48));
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    *puVar22 = &PTR__t_node_0019b458;
    puVar22[4] = ptVar23;
    ptVar20 = (t_script *)operator_new(0x48);
    uVar29 = (long)pwVar28 + (-0x50 - (long)ptVar18);
    (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
    (ptVar20->v_path)._M_dataplus._M_p = (pointer)local_80._8_8_;
    (ptVar20->v_path)._M_string_length = (size_type)pFStack_70;
    (ptVar20->v_path).field_2._M_allocated_capacity = local_68;
    (ptVar20->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_call_0019b298;
    *(undefined8 **)((long)&(ptVar20->v_path).field_2 + 8) = puVar22;
    (ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    *(undefined8 *)
     ((long)&(ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_map_size + 1) = 0;
    *(undefined8 *)
     ((long)&(ptVar20->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur + 1) = 0;
    if ((this_02->v_lexer).v_newline == true) {
      if (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))) {
        tVar7 = (this_02->v_lexer).v_token;
        goto joined_r0x00168d75;
      }
    }
    else {
      tVar7 = (this_02->v_lexer).v_token;
joined_r0x00168d75:
      if (tVar7 != c_token__RIGHT_BRACKET) {
        bVar16 = f_expressions(this_02,(long)uVar29 >> 2,
                               (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                                *)&ptVar20->v_slots);
        *(bool *)&(ptVar20->v_slots).
                  super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first = bVar16;
      }
    }
    if ((((this_02->v_lexer).v_newline != true) ||
        (uVar29 <= (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token == c_token__RIGHT_BRACKET)) {
      t_lexer::f_next((t_lexer *)CONCAT71(uVar37,uVar36));
    }
LAB_00168ee9:
    this->v_module = ptVar20;
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
  case c_token__LEFT_BRACE:
    pwVar28 = (this_02->v_lexer).v_indent.v_i;
    ptVar18 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar23 = t_script::f_slot(this_02->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1d8) + -0x48));
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    *puVar22 = &PTR__t_node_0019b458;
    puVar22[4] = ptVar23;
    puVar19 = (undefined8 *)operator_new(0x48);
    uVar29 = (long)pwVar28 + (-0x50 - (long)ptVar18);
    *puVar19 = &PTR__t_node_0019ac90;
    puVar19[1] = local_80._8_8_;
    puVar19[2] = pFStack_70;
    puVar19[3] = local_68;
    *puVar19 = &PTR__t_call_0019b298;
    puVar19[4] = puVar22;
    puVar19[5] = 0;
    puVar19[6] = 0;
    *(undefined8 *)((long)puVar19 + 0x31) = 0;
    *(undefined8 *)((long)puVar19 + 0x39) = 0;
    if ((((this_02->v_lexer).v_newline != true) ||
        (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                         (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token != c_token__RIGHT_BRACE)) {
      do {
        while( true ) {
          f_expression((t_parser *)local_98);
          std::
          vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
          ::
          emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                    ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                      *)(puVar19 + 5),
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     local_98);
          if ((t_script *)local_98._0_8_ != (t_script *)0x0) {
            (*(code *)((t_object *)((t_body *)local_98._0_8_)->_vptr_t_body)->v_previous)();
          }
          if (((this_02->v_lexer).v_token != c_token__COLON) ||
             ((this_02->v_lexer).field_11.v_string != (t_object *)0x1)) {
            a_message_00._M_str = L"expecting \':\'.";
            a_message_00._M_len = 0xe;
            f_throw(this_02,a_message_00);
          }
          t_lexer::f_next((t_lexer *)this_03);
          f_expression((t_parser *)local_98);
          std::
          vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
          ::
          emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                    ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                      *)(puVar19 + 5),
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     local_98);
          if ((t_node *)local_98._0_8_ != (t_node *)0x0) {
            (**(code **)(*(long *)local_98._0_8_ + 8))();
          }
          bVar16 = (this_02->v_lexer).v_newline;
          if ((this_02->v_lexer).v_token != c_token__COMMA) break;
          if ((bVar16 != false) &&
             ((ulong)((long)(this_02->v_lexer).v_indent.v_i +
                     (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)) < uVar29)) goto LAB_0016893e;
          t_lexer::f_next((t_lexer *)this_03);
        }
      } while ((bVar16 != false) &&
              (uVar29 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                               (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))));
    }
LAB_0016893e:
    if ((((this_02->v_lexer).v_newline != true) ||
        (uVar29 <= (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token == c_token__RIGHT_BRACE)) {
      t_lexer::f_next((t_lexer *)this_03);
    }
LAB_00168c7c:
    (local_58._M_head_impl)->_vptr_t_node = puVar19;
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
           local_58._M_head_impl;
  case c_token__NULL:
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x20);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    ppuVar25 = &PTR__t_node_0019b1c0;
    break;
  case c_token__TRUE:
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    puVar22[4] = 2;
    goto LAB_001683e9;
  case c_token__FALSE:
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    puVar22[4] = 1;
LAB_001683e9:
    ppuVar25 = &PTR__t_node_0019b3f8;
    break;
  case c_token__INTEGER:
    aVar21 = (this_02->v_lexer).field_11;
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    ppuVar25 = &PTR__t_node_0019b488;
    goto LAB_0016858d;
  case c_token__FLOAT:
    iVar6 = (this_02->v_lexer).field_11.v_integer;
    uVar36 = (undefined1)iVar6;
    uVar37 = (undefined7)((ulong)iVar6 >> 8);
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    *puVar22 = &PTR__t_node_0019b4d0;
    puVar22[4] = CONCAT71(uVar37,uVar36);
    goto LAB_00168e48;
  case c_token__STRING:
    ptVar18 = (this_02->v_lexer).field_11.v_string;
    t_lexer::f_next((t_lexer *)this_03);
    aVar21.v_string = t_script::f_slot(this_02->v_module,ptVar18);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    puVar22[1] = local_80._8_8_;
    puVar22[2] = pFStack_70;
    puVar22[3] = local_68;
    ppuVar25 = &PTR__t_node_0019b458;
LAB_0016858d:
    *puVar22 = ppuVar25;
    ((anon_union_8_3_60b33e96_for_t_lexer_12 *)(puVar22 + 4))->v_string = (t_object *)aVar21;
    goto LAB_00168e48;
  case c_token__BREAK:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    if (this_02->v_can_jump == false) {
LAB_0016935c:
      a_message_02._M_str = L"expecting inside loop.";
      a_message_02._M_len = 0x16;
      f_throw(this_02,a_message_02,(t_at *)local_98);
    }
    t_lexer::f_next((t_lexer *)this_03);
    if (((this_02->v_lexer).v_newline == false) && (6 < (this_02->v_lexer).v_token - c_token__IF)) {
      f_expression((t_parser *)&stack0xffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff58 = (t_script *)0x0;
    }
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar22 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
         (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
    puVar22[2] = local_98._8_8_;
    puVar22[3] = local_98._16_8_;
    ppuVar25 = &PTR__t_break_0019adb8;
    goto LAB_00168e35;
  case c_token__CONTINUE:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    if (this_02->v_can_jump == false) goto LAB_0016935c;
    t_lexer::f_next((t_lexer *)this_03);
    puVar22 = (undefined8 *)operator_new(0x20);
    *puVar22 = &PTR__t_node_0019ac90;
    ((__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar22 + 1))->_M_t =
         (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)local_98._0_8_;
    puVar22[2] = local_98._8_8_;
    puVar22[3] = local_98._16_8_;
    ppuVar25 = &PTR__t_node_0019ae00;
    break;
  case c_token__RETURN:
    if (this_02->v_can_return == false) {
      pwVar28 = L"expecting within lambda.";
      goto LAB_001693c9;
    }
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    t_lexer::f_next((t_lexer *)this_03);
    if (((this_02->v_lexer).v_newline == false) && (6 < (this_02->v_lexer).v_token - c_token__IF)) {
      f_expression((t_parser *)&stack0xffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff58 = (t_script *)0x0;
    }
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar22 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
         (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
    puVar22[2] = local_98._8_8_;
    puVar22[3] = local_98._16_8_;
    ppuVar25 = &PTR__t_return_0019ae48;
    goto LAB_00168e35;
  case c_token__THROW:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    t_lexer::f_next((t_lexer *)this_03);
    f_expression((t_parser *)&stack0xffffffffffffff58);
    puVar22 = (undefined8 *)operator_new(0x28);
    *puVar22 = &PTR__t_node_0019ac90;
    ((tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)(puVar22 + 1))->
    super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> =
         (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
         local_98._0_8_;
    puVar22[2] = local_98._8_8_;
    puVar22[3] = local_98._16_8_;
    ppuVar25 = &PTR__t_throw_0019ae90;
LAB_00168e35:
    *puVar22 = ppuVar25;
    puVar22[4] = in_stack_ffffffffffffff58;
    goto LAB_00168e48;
  }
  *puVar22 = ppuVar25;
LAB_00168e48:
  *(undefined8 **)this = puVar22;
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_target(bool a_assignable)
{
	t_at at = v_lexer.f_at();
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__COLON:
	case t_lexer::c_token__SYMBOL:
	case t_lexer::c_token__SELF:
		{
			size_t outer = 0;
			auto scope = v_scope;
			if (v_lexer.f_token() == t_lexer::c_token__COLON) {
				outer = v_lexer.f_integer();
				for (size_t i = 0; i < outer; ++i) {
					if (!scope) f_throw(L"no more outer scope."sv);
					scope = scope->v_outer;
				}
				v_lexer.f_next();
			}
			switch (v_lexer.f_token()) {
			case t_lexer::c_token__SYMBOL:
				{
					auto symbol = f_symbol();
					v_lexer.f_next();
					if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
						if (!a_assignable) f_throw(L"can not assign to expression."sv);
						if (!scope) f_throw(L"no more outer scope."sv);
						v_lexer.f_next();
						auto& variable = f_variable(scope, symbol);
						if (outer > 0) variable.v_shared = variable.v_varies = true;
						return std::make_unique<ast::t_scope_put>(at, outer, variable, f_expression());
					}
					if (scope) (outer > 0 ? scope->v_unresolveds : scope->v_references).insert(symbol);
					return std::make_unique<ast::t_symbol_get>(at, outer, scope, symbol);
				}
			case t_lexer::c_token__SELF:
				{
					if (!scope) f_throw(L"no more outer scope."sv);
					if (outer > 0) scope->v_self_shared = true;
					std::unique_ptr<ast::t_node> target(new ast::t_self(at, outer));
					for (auto c : v_lexer.f_value()) target.reset(c == L'@' ? new ast::t_class(at, std::move(target)) : static_cast<ast::t_node*>(new ast::t_super(at, std::move(target))));
					v_lexer.f_next();
					if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__SYMBOL) {
						t_at at = v_lexer.f_at();
						auto key = f_symbol();
						v_lexer.f_next();
						if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
							if (!a_assignable) f_throw(L"can not assign to expression."sv);
							v_lexer.f_next();
							return std::make_unique<ast::t_object_put>(at, std::move(target), key, f_expression());
						}
						return std::make_unique<ast::t_object_get>(at, std::move(target), key);
					}
					return target;
				}
			default:
				f_throw(L"expecting symbol or self."sv);
			}
		}
	case t_lexer::c_token__APOSTROPHE:
		v_lexer.f_next();
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__SYMBOL:
			{
				auto symbol = f_symbol();
				v_lexer.f_next();
				return std::make_unique<ast::t_literal<t_object*>>(at, symbol);
			}
		case t_lexer::c_token__LEFT_PARENTHESIS:
			{
				size_t indent = v_lexer.f_indent();
				v_lexer.f_next();
				auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_tuple>()))));
				if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) call->v_expand = f_expressions(indent, call->v_arguments);
				if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_PARENTHESIS) v_lexer.f_next();
				return call;
			}
		default:
			f_throw(L"expecting symbol or '('."sv);
		}
	case t_lexer::c_token__LEFT_PARENTHESIS:
		{
			v_lexer.f_next();
			auto expression = f_expression();
			if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
			v_lexer.f_next();
			return expression;
		}
	case t_lexer::c_token__ATMARK:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto lambda = std::make_unique<ast::t_lambda>(at, v_scope);
			if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__LEFT_PARENTHESIS) {
				v_lexer.f_next();
				if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) {
					while (true) {
						switch (v_lexer.f_token()) {
						case t_lexer::c_token__SYMBOL:
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							v_lexer.f_next();
							if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
								v_lexer.f_next();
								lambda->v_defaults.push_back(f_expression());
							} else {
								if (lambda->v_defaults.size() > 0) f_throw(L"expecting '='."sv);
							}
							if (v_lexer.f_newline() && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) continue;
							if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
								v_lexer.f_next();
								continue;
							}
							break;
						case t_lexer::c_token__ASTERISK:
							v_lexer.f_next();
							if (v_lexer.f_token() != t_lexer::c_token__SYMBOL) f_throw(L"expecting symbol."sv);
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							lambda->v_variadic = true;
							v_lexer.f_next();
							break;
						default:
							f_throw(L"expecting symbol or '*'."sv);
						}
						break;
					}
					if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
				}
				v_lexer.f_next();
			}
			lambda->v_arguments = lambda->v_variables.size();
			v_scope->v_shared = true;
			v_scope = lambda.get();
			bool can_jump = v_can_jump;
			bool can_return = v_can_return;
			v_can_return = true;
			if (v_lexer.f_newline()) {
				if (v_lexer.f_indent() > indent) f_block(lambda->v_block);
			} else {
				lambda->v_block.push_back(f_expression());
				if (v_lexer.f_newline() && v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
			}
			for (auto symbol : lambda->v_unresolveds) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end())
					lambda->v_outer->v_unresolveds.insert(symbol);
				else
					i->second.v_shared = true;
			}
			for (auto symbol : lambda->v_references) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end()) lambda->v_outer->v_unresolveds.insert(symbol);
			}
			v_scope = lambda->v_outer;
			v_can_jump = can_jump;
			v_can_return = can_return;
			std::vector<t_code::t_variable*> variables;
			variables.swap(lambda->v_privates);
			if (lambda->v_self_shared) ++lambda->v_shareds;
			auto i = variables.begin();
			for (auto j = i + lambda->v_arguments; i != j; ++i) {
				t_code::t_variable* p = *i;
				p->v_index = p->v_shared ? lambda->v_shareds++ : lambda->v_privates.size();
				lambda->v_privates.push_back(p);
			}
			for (; i != variables.end(); ++i) {
				t_code::t_variable* p = *i;
				if (p->v_shared) {
					p->v_index = lambda->v_shareds++;
				} else {
					p->v_index = lambda->v_privates.size();
					lambda->v_privates.push_back(p);
				}
			}
			return lambda;
		}
	case t_lexer::c_token__LEFT_BRACKET:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_list>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACKET) call->v_expand = f_expressions(indent, call->v_arguments);
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACKET) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__LEFT_BRACE:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_map>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACE)
				while (true) {
					call->v_arguments.push_back(f_expression());
					if (!f_single_colon()) f_throw(L"expecting ':'."sv);
					v_lexer.f_next();
					call->v_arguments.push_back(f_expression());
					if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
						if (v_lexer.f_newline() && v_lexer.f_indent() < indent) break;
						v_lexer.f_next();
						continue;
					}
					if (!v_lexer.f_newline() || v_lexer.f_indent() <= indent) break;
				}
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACE) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__NULL:
		v_lexer.f_next();
		return std::make_unique<ast::t_null>(at);
	case t_lexer::c_token__TRUE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, true);
	case t_lexer::c_token__FALSE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, false);
	case t_lexer::c_token__INTEGER:
		{
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<intptr_t>>(at, value);
		}
	case t_lexer::c_token__FLOAT:
		{
			auto value = v_lexer.f_float();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<double>>(at, value);
		}
	case t_lexer::c_token__STRING:
		{
			auto value = v_lexer.f_string();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(value));
		}
	case t_lexer::c_token__BREAK:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_break>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__CONTINUE:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_continue>(at);
		}
	case t_lexer::c_token__RETURN:
		{
			if (!v_can_return) f_throw(L"expecting within lambda."sv);
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_return>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__THROW:
		{
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_throw>(at, f_expression());
		}
	default:
		f_throw(L"unexpected token."sv);
	}
}